

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

void __thiscall luna::GC::DestroyGeneration(GC *this,GenInfo *gen)

{
  uint local_34;
  GCObject *local_30;
  
  local_30 = gen->gen_;
  if (local_30 != (GCObject *)0x0) {
    do {
      gen->gen_ = local_30->next_;
      local_34 = (uint)((byte)local_30->field_0x10 >> 4);
      if ((this->obj_deleter_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->obj_deleter_)._M_invoker)((_Any_data *)&this->obj_deleter_,&local_30,&local_34);
      local_30 = gen->gen_;
    } while (local_30 != (GCObject *)0x0);
  }
  gen->count_ = 0;
  return;
}

Assistant:

void GC::DestroyGeneration(GenInfo &gen)
    {
        while (gen.gen_)
        {
            GCObject *obj = gen.gen_;
            gen.gen_ = gen.gen_->next_;
            obj_deleter_(obj, obj->gc_obj_type_);
        }
        gen.count_ = 0;
    }